

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcExact.c
# Opt level: O0

int Ses_ManFindNetworkExact(Ses_Man_t *pSes,int nGates)

{
  sat_solver *s;
  int iVar1;
  abctime aVar2;
  abctime aVar3;
  int *pVars;
  abctime timeStart;
  int fSat;
  int f;
  int nGates_local;
  Ses_Man_t *pSes_local;
  
  aVar2 = Abc_Clock();
  Vec_IntClear(pSes->vPolar);
  Vec_IntClear(pSes->vAssump);
  Ses_ManCreateVars(pSes,nGates);
  if (pSes->nMaxDepth != -1) {
    iVar1 = Ses_ManCreateDepthClauses(pSes);
    aVar3 = Abc_Clock();
    pSes->timeInstance = (aVar3 - aVar2) + pSes->timeInstance;
    if (iVar1 == 0) {
      return 2;
    }
  }
  s = pSes->pSat;
  pVars = Vec_IntArray(pSes->vPolar);
  iVar1 = Vec_IntSize(pSes->vPolar);
  sat_solver_set_polarity(s,pVars,iVar1);
  iVar1 = Ses_ManSolve(pSes);
  if (iVar1 == 0) {
    pSes_local._4_4_ = 2;
  }
  else if (iVar1 == 2) {
    pSes->fHitResLimit = 1;
    pSes_local._4_4_ = 0;
  }
  else {
    aVar2 = Abc_Clock();
    iVar1 = Ses_ManCreateClauses(pSes);
    aVar3 = Abc_Clock();
    pSes->timeInstance = (aVar3 - aVar2) + pSes->timeInstance;
    if (iVar1 == 0) {
      pSes_local._4_4_ = 2;
    }
    else {
      iVar1 = Ses_ManSolve(pSes);
      if (iVar1 == 1) {
        pSes_local._4_4_ = 1;
      }
      else if (iVar1 == 2) {
        pSes->fHitResLimit = 1;
        pSes_local._4_4_ = 0;
      }
      else {
        pSes_local._4_4_ = 2;
      }
    }
  }
  return pSes_local._4_4_;
}

Assistant:

static int Ses_ManFindNetworkExact( Ses_Man_t * pSes, int nGates )
{
    int f, fSat;
    abctime timeStart;

    /* solve */
    timeStart = Abc_Clock();
    Vec_IntClear( pSes->vPolar );
    Vec_IntClear( pSes->vAssump );
    Ses_ManCreateVars( pSes, nGates );

    if ( pSes->nMaxDepth != -1 )
    {
        f = Ses_ManCreateDepthClauses( pSes );
        pSes->timeInstance += ( Abc_Clock() - timeStart );
        if ( !f ) return 2; /* proven UNSAT while creating clauses */
    }

    sat_solver_set_polarity( pSes->pSat, Vec_IntArray( pSes->vPolar ), Vec_IntSize( pSes->vPolar ) );

    /* first solve */
    fSat = Ses_ManSolve( pSes );
    if ( fSat == 0 )
        return 2; /* UNSAT, continue with next # of gates */
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    timeStart = Abc_Clock();
    f = Ses_ManCreateClauses( pSes );
    pSes->timeInstance += ( Abc_Clock() - timeStart );
    if ( !f ) return 2; /* proven UNSAT while creating clauses */

    fSat = Ses_ManSolve( pSes );
    if ( fSat == 1 )
        return 1;
    else if ( fSat == 2 )
    {
        pSes->fHitResLimit = 1;
        return 0;
    }

    return 2; /* UNSAT continue */
}